

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest17::getTessellationControlShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest17 *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout (vertices = 4) out;\n\nsubroutine void subroutineTypeTC(out vec4 result);\n\nsubroutine(subroutineTypeTC) void subroutine1(out vec4 result)\n{\n    result = vec4(2, 3, 4, 5);\n}\n\nsubroutine uniform subroutineTypeTC function;\n\nin VS_DATA\n{\n    vec4 vs_data;\n} vs[];\n\nout TC_DATA\n{\n    vec4 tc_data;\n    vec4 vs_data;\n} result[];\n\nvoid main()\n{\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n\n    function(result[gl_InvocationID].tc_data);\n    result[gl_InvocationID].vs_data = vs[gl_InvocationID].vs_data;\n}\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionalTest17::getTessellationControlShaderBody() const
{
	return "#version 400\n"
		   "\n"
		   "#extension GL_ARB_shader_subroutine : require\n"
		   "\n"
		   "layout (vertices = 4) out;\n"
		   "\n"
		   "subroutine void subroutineTypeTC(out vec4 result);\n"
		   "\n"
		   "subroutine(subroutineTypeTC) void subroutine1(out vec4 result)\n"
		   "{\n"
		   "    result = vec4(2, 3, 4, 5);\n"
		   "}\n"
		   "\n"
		   "subroutine uniform subroutineTypeTC function;\n"
		   "\n"
		   "in VS_DATA\n"
		   "{\n"
		   "    vec4 vs_data;\n"
		   "} vs[];\n"
		   "\n"
		   "out TC_DATA\n"
		   "{\n"
		   "    vec4 tc_data;\n"
		   "    vec4 vs_data;\n"
		   "} result[];\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    gl_TessLevelInner[0] = 1.0;\n"
		   "    gl_TessLevelInner[1] = 1.0;\n"
		   "    gl_TessLevelOuter[0] = 1.0;\n"
		   "    gl_TessLevelOuter[1] = 1.0;\n"
		   "    gl_TessLevelOuter[2] = 1.0;\n"
		   "    gl_TessLevelOuter[3] = 1.0;\n"
		   "\n"
		   "    function(result[gl_InvocationID].tc_data);\n"
		   "    result[gl_InvocationID].vs_data = vs[gl_InvocationID].vs_data;\n"
		   "}\n";
}